

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_18bb43::TwoValuesWithHashCollision::check_collision
          (TwoValuesWithHashCollision *this,uint64_t first_hash,uint64_t second_hash,
          uint collision_level)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  bVar1 = (char)second_hash * '\x06';
  uVar2 = ~(-1L << (bVar1 & 0x3f));
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (uVar2 & (ulong)this);
  local_40.data_ = (AssertHelperData *)(uVar2 & first_hash);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_30,"first_hash & mask","second_hash & mask",(unsigned_long *)&local_38,
             (unsigned_long *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x2d8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)((uint)((ulong)this >> (bVar1 & 0x3f)) & 0x3f);
  local_40.data_ = (AssertHelperData *)(ulong)((uint)(first_hash >> (bVar1 & 0x3f)) & 0x3f);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            (local_30,"shifted_first_hash & shifted_mask","shifted_second_hash & shifted_mask",
             (unsigned_long *)&local_38,(unsigned_long *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x2dd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  return;
}

Assistant:

void TwoValuesWithHashCollision::check_collision (std::uint64_t const first_hash,
                                                      std::uint64_t const second_hash,
                                                      unsigned collision_level) {
        ASSERT_TRUE (collision_level < 11);
        auto const shift = 6U * collision_level;
        auto const mask = (UINT64_C (1) << shift) - 1U;
        EXPECT_EQ (first_hash & mask, second_hash & mask);

        auto const shifted_first_hash = first_hash >> shift;
        auto const shifted_second_hash = second_hash >> shift;
        auto const shifted_mask = (UINT64_C (1) << 6) - 1U;
        EXPECT_NE (shifted_first_hash & shifted_mask, shifted_second_hash & shifted_mask);
    }